

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagecodec.hpp
# Opt level: O0

uvec4 ImageCodec::decodeUINT_UINTVec<unsigned_int,4>(ImageCodec *param_1,void *ptr)

{
  uint uVar1;
  uint *puVar2;
  vec<4,_unsigned_int,_(glm::precision)0> *in_RSI;
  int i;
  uint *data;
  uvec4 result;
  int local_2c;
  vec<4,_unsigned_int,_(glm::precision)0> *this;
  anon_union_16_4_ea85571f_for_vec<4,_unsigned_int,_(glm::precision)0>_3 local_10;
  
  this = in_RSI;
  glm::vec<4,unsigned_int,(glm::precision)0>::vec<int,int,int,int>
            ((vec<4,unsigned_int,(glm::precision)0> *)&local_10.field_0,0,0,0,0);
  for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
    uVar1 = *(uint *)((long)&in_RSI->field_0 + (long)local_2c * 4);
    puVar2 = glm::vec<4,_unsigned_int,_(glm::precision)0>::operator[]
                       (this,(length_type)((ulong)in_RSI >> 0x20));
    *puVar2 = uVar1;
  }
  return (anon_union_16_4_ea85571f_for_vec<4,_unsigned_int,_(glm::precision)0>_3)
         (anon_union_16_4_ea85571f_for_vec<4,_unsigned_int,_(glm::precision)0>_3)local_10.field_0;
}

Assistant:

static glm::uvec4 decodeUINT_UINTVec(const ImageCodec*, const void* ptr) {
        static_assert(std::is_unsigned_v<TYPE>);
        static_assert((COMPONENTS > 0) && (COMPONENTS <= 4));
        auto data = reinterpret_cast<const TYPE*>(ptr);
        glm::uvec4 result(0, 0, 0, 0);
        for (int i = 0; i < COMPONENTS; ++i)
            result[i] = data[i];
        return result;
    }